

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O3

int __thiscall SingleFile::GetType(SingleFile *this)

{
  ITypeManager *pIVar1;
  pointer pcVar2;
  int iVar3;
  long *local_38 [2];
  long local_28 [2];
  
  pIVar1 = (this->super_IContainedElement).type_manager_;
  iVar3 = (*pIVar1->_vptr_ITypeManager[1])(pIVar1,this->buffer_,(ulong)(uint)this->buffer_size_);
  if (iVar3 == 0) {
    pIVar1 = (this->super_IContainedElement).type_manager_;
    pcVar2 = (this->file_name_)._M_dataplus._M_p;
    local_38[0] = local_28;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_38,pcVar2,pcVar2 + (this->file_name_)._M_string_length);
    iVar3 = (**pIVar1->_vptr_ITypeManager)(pIVar1,local_38);
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
  }
  return iVar3;
}

Assistant:

int SingleFile::GetType()
{
   // Check from buffer
   int type = type_manager_->GetTypeFromBuffer(buffer_, buffer_size_);
   if (type == 0)
      return type_manager_->GetTypeFromFile(file_name_);
   return type;
}